

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboCases::SharedColorbufferClearsTest::SharedColorbufferClearsTest
          (SharedColorbufferClearsTest *this,Context *context,FboConfig *config)

{
  char *name;
  string local_40;
  FboConfig *local_20;
  FboConfig *config_local;
  Context *context_local;
  SharedColorbufferClearsTest *this_local;
  
  local_20 = config;
  config_local = (FboConfig *)context;
  context_local = (Context *)this;
  FboConfig::getName_abi_cxx11_(&local_40,config);
  name = (char *)std::__cxx11::string::c_str();
  FboRenderCase::FboRenderCase
            (&this->super_FboRenderCase,context,name,"Shared colorbuffer clears",local_20);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SharedColorbufferClearsTest_032b2f90;
  return;
}

Assistant:

SharedColorbufferClearsTest::SharedColorbufferClearsTest (Context& context, const FboConfig& config)
	: FboRenderCase	(context, config.getName().c_str(), "Shared colorbuffer clears", config)
{
}